

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ScaleLayerParams::InternalSwap
          (ScaleLayerParams *this,ScaleLayerParams *other)

{
  ScaleLayerParams *other_local;
  ScaleLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->shapescale_,&other->shapescale_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->shapebias_,&other->shapebias_)
  ;
  std::swap<CoreML::Specification::WeightParams*>(&this->scale_,&other->scale_);
  std::swap<CoreML::Specification::WeightParams*>(&this->bias_,&other->bias_);
  std::swap<bool>(&this->hasbias_,&other->hasbias_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ScaleLayerParams::InternalSwap(ScaleLayerParams* other) {
  shapescale_.InternalSwap(&other->shapescale_);
  shapebias_.InternalSwap(&other->shapebias_);
  std::swap(scale_, other->scale_);
  std::swap(bias_, other->bias_);
  std::swap(hasbias_, other->hasbias_);
  std::swap(_cached_size_, other->_cached_size_);
}